

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O1

void __thiscall CppUnit::TestPath::TestPath(TestPath *this,Test *searchRoot,string *pathAsString)

{
  int iVar1;
  int iVar2;
  Test *pTVar3;
  undefined4 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_00;
  invalid_argument *this_00;
  long *plVar5;
  _Elt_pointer pbVar6;
  ulong uVar7;
  size_type *psVar8;
  long *plVar9;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int childIndex;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  PathTestNames testNames;
  long *local_120;
  size_t local_118;
  long local_110;
  long lStack_108;
  string *local_100;
  Tests *local_f8;
  TestPath *local_f0;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->_vptr_TestPath = (_func_int **)&PTR__TestPath_00143170;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::_M_initialize_map
            (&(this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>,0
            );
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_e8,0);
  local_100 = pathAsString;
  local_f8 = &this->m_tests;
  pTVar3 = findActualRoot(this,searchRoot,pathAsString,(PathTestNames *)&local_e8);
  (*this->_vptr_TestPath[3])(this,pTVar3);
  uVar13 = 1;
  local_f0 = this;
  do {
    uVar12 = (ulong)uVar13;
    if (((long)local_e8._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)local_e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
        ((long)local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)local_e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
        ((((ulong)((long)local_e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                  (long)local_e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(local_e8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
        0x10 <= uVar12) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_e8);
      return;
    }
    uVar7 = 0;
    while( true ) {
      iVar1 = (*pTVar3->_vptr_Test[4])(pTVar3);
      iVar11 = (int)uVar7;
      if (iVar1 <= iVar11) break;
      iVar2 = (*pTVar3->_vptr_Test[5])(pTVar3,uVar7);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))
                (&local_120,(long *)CONCAT44(extraout_var,iVar2));
      uVar4 = ((long)local_e8._M_impl.super__Deque_impl_data._M_start._M_cur -
               (long)local_e8._M_impl.super__Deque_impl_data._M_start._M_first >> 5) + uVar12;
      if (uVar4 < 0x10) {
        pbVar6 = local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + uVar12;
      }
      else {
        uVar10 = uVar4 >> 4 | 0xf000000000000000;
        if (0 < (long)uVar4) {
          uVar10 = uVar4 >> 4;
        }
        pbVar6 = local_e8._M_impl.super__Deque_impl_data._M_start._M_node[uVar10] +
                 uVar4 + uVar10 * -0x10;
      }
      if (local_118 == pbVar6->_M_string_length) {
        if (local_118 == 0) {
          bVar14 = true;
        }
        else {
          iVar2 = bcmp(local_120,(pbVar6->_M_dataplus)._M_p,local_118);
          bVar14 = iVar2 == 0;
        }
      }
      else {
        bVar14 = false;
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      if (bVar14) {
        iVar2 = (*pTVar3->_vptr_Test[5])(pTVar3,uVar7);
        pTVar3 = (Test *)CONCAT44(extraout_var_00,iVar2);
        break;
      }
      uVar7 = (ulong)(iVar11 + 1);
    }
    if (iVar1 <= iVar11) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      uVar7 = ((long)local_e8._M_impl.super__Deque_impl_data._M_start._M_cur -
               (long)local_e8._M_impl.super__Deque_impl_data._M_start._M_first >> 5) + uVar12;
      if (uVar7 < 0x10) {
        __rhs = local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + uVar12;
      }
      else {
        uVar12 = uVar7 >> 4 | 0xf000000000000000;
        if (0 < (long)uVar7) {
          uVar12 = uVar7 >> 4;
        }
        __rhs = local_e8._M_impl.super__Deque_impl_data._M_start._M_node[uVar12] +
                uVar7 + uVar12 * -0x10;
      }
      std::operator+(&local_70,"TestPath::TestPath(): failed to resolve test name <",__rhs);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_90._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar8) {
        local_90.field_2._M_allocated_capacity = *psVar8;
        local_90.field_2._8_8_ = plVar5[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar8;
      }
      local_90._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::operator+(&local_50,&local_90,local_100);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_120 = (long *)*plVar5;
      plVar9 = plVar5 + 2;
      if (local_120 == plVar9) {
        local_110 = *plVar9;
        lStack_108 = plVar5[3];
        local_120 = &local_110;
      }
      else {
        local_110 = *plVar9;
      }
      local_118 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::invalid_argument::invalid_argument(this_00,(string *)&local_120);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    (*local_f0->_vptr_TestPath[3])(local_f0,pTVar3);
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

TestPath::TestPath( Test *searchRoot, 
                    const std::string &pathAsString )
    : m_tests()
{
  PathTestNames testNames;

  Test *parentTest = findActualRoot( searchRoot, pathAsString, testNames );
  add( parentTest );

  for ( unsigned int index = 1; index < testNames.size(); ++index )
  {
    bool childFound = false;
    for ( int childIndex =0; childIndex < parentTest->getChildTestCount(); ++childIndex )
    {
      if ( parentTest->getChildTestAt( childIndex )->getName() == testNames[index] )
      {
        childFound = true;
        parentTest = parentTest->getChildTestAt( childIndex );
        break;
      }
    }

    if ( !childFound )
      throw std::invalid_argument( "TestPath::TestPath(): failed to resolve test name <"+
                                   testNames[index] + "> of path <" + pathAsString + ">" );

    add( parentTest );
  }
}